

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ClassDeclarationSyntax::isChildOptional(size_t index)

{
  size_t index_local;
  bool local_1;
  
  switch(index) {
  case 3:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case 5:
    local_1 = true;
    break;
  case 6:
    local_1 = true;
    break;
  case 7:
    local_1 = true;
    break;
  case 0xb:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ClassDeclarationSyntax::isChildOptional(size_t index) {
    switch (index) {
        case 3: return true;
        case 5: return true;
        case 6: return true;
        case 7: return true;
        case 11: return true;
        default: return false;
    }
}